

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O0

uint16_t __thiscall ProtocolTCP::NewPort(ProtocolTCP *this)

{
  int local_14;
  int i;
  ProtocolTCP *this_local;
  
  if (this->NextPort < 0x401) {
    this->NextPort = 0x400;
  }
  this->NextPort = this->NextPort + 1;
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    if (*(uint16_t *)(&this->field_0x4 + (long)local_14 * 0x370) == this->NextPort) {
      this->NextPort = this->NextPort + 1;
      local_14 = -1;
    }
  }
  return this->NextPort;
}

Assistant:

uint16_t ProtocolTCP::NewPort()
{
    int i;

    if (NextPort <= 1024)
    {
        NextPort = 1024;
    }

    NextPort++;

    for (i = 0; i < TCP_MAX_CONNECTIONS; i++)
    {
        if (ConnectionList[i].LocalPort == NextPort)
        {
            NextPort++;
            i = -1;
        }
    }

    return NextPort;
}